

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugAnalysePrimalDualErrors(HighsOptions *options,HighsPrimalDualErrors *primal_dual_errors)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  uint *in_RSI;
  long in_RDI;
  bool force_report;
  HighsDebugStatus return_status;
  HighsLogType report_level;
  string value_adjective;
  HighsDebugStatus local_38;
  uint local_34;
  string local_30 [32];
  uint *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  local_38 = kOk;
  bVar1 = 1 < *(int *)(local_8 + 0x15c);
  if (-1 < (int)*local_10) {
    if ((int)*local_10 < 1) {
      std::__cxx11::string::operator=(local_30,"");
      local_34 = 3;
      local_38 = kOk;
    }
    else {
      std::__cxx11::string::operator=(local_30,"Error");
      local_34 = 5;
      local_38 = kLogicalError;
    }
    if (bVar1) {
      local_34 = 1;
    }
    pcVar2 = (char *)(local_8 + 0x380);
    uVar3 = std::__cxx11::string::c_str();
    highsLogDev(*(HighsLogOptions **)(local_10 + 2),local_10[4],pcVar2,(ulong)local_34,
                "PrDuErrors : %-9s Nonzero basic duals:       num = %7d; max = %9.4g; sum = %9.4g\n"
                ,uVar3,(ulong)*local_10);
  }
  if (-1 < (int)local_10[6]) {
    if ((int)local_10[6] < 1) {
      std::__cxx11::string::operator=(local_30,"");
      local_34 = 3;
      local_38 = kOk;
    }
    else {
      std::__cxx11::string::operator=(local_30,"Error");
      local_34 = 5;
      local_38 = kLogicalError;
    }
    if (bVar1) {
      local_34 = 1;
    }
    pcVar2 = (char *)(local_8 + 0x380);
    uVar3 = std::__cxx11::string::c_str();
    highsLogDev(*(HighsLogOptions **)(local_10 + 8),local_10[10],pcVar2,(ulong)local_34,
                "PrDuErrors : %-9s Off-bound nonbasic values: num = %7d; max = %9.4g; sum = %9.4g\n"
                ,uVar3,(ulong)local_10[6]);
  }
  if (-1 < (int)local_10[0xc]) {
    if (*(double *)(local_10 + 0x14) <= excessive_residual_error) {
      if (*(double *)(local_10 + 0x14) <= 1e-12) {
        std::__cxx11::string::operator=(local_30,"");
        local_34 = 3;
        local_38 = kOk;
      }
      else {
        std::__cxx11::string::operator=(local_30,"Large");
        local_34 = 2;
        local_38 = kWarning;
      }
    }
    else {
      std::__cxx11::string::operator=(local_30,"Excessive");
      local_34 = 5;
      local_38 = kError;
    }
    if (bVar1) {
      local_34 = 1;
    }
    pcVar2 = (char *)(local_8 + 0x380);
    uVar3 = std::__cxx11::string::c_str();
    highsLogDev(*(HighsLogOptions **)(local_10 + 0x14),local_10[0xe],pcVar2,(ulong)local_34,
                "PrDuErrors : %-9s Primal residual:           num = %7d; max = %9.4g; sum = %9.4g\n"
                ,uVar3,(ulong)local_10[0xc]);
  }
  if (-1 < (int)local_10[0x10]) {
    if (*(double *)(local_10 + 0x24) <= excessive_residual_error) {
      if (*(double *)(local_10 + 0x24) <= 1e-12) {
        std::__cxx11::string::operator=(local_30,"");
        local_34 = 3;
        local_38 = kOk;
      }
      else {
        std::__cxx11::string::operator=(local_30,"Large");
        local_34 = 2;
        local_38 = kWarning;
      }
    }
    else {
      std::__cxx11::string::operator=(local_30,"Excessive");
      local_34 = 5;
      local_38 = kError;
    }
    if (bVar1) {
      local_34 = 1;
    }
    uVar3 = std::__cxx11::string::c_str();
    highsLogDev(*(HighsLogOptions **)(local_10 + 0x24),local_10[0x12],(char *)(local_8 + 0x380),
                (ulong)local_34,
                "PrDuErrors : %-9s Dual residual:             num = %7d; max = %9.4g; sum = %9.4g\n"
                ,uVar3,(ulong)local_10[0x10]);
  }
  std::__cxx11::string::~string(local_30);
  return local_38;
}

Assistant:

HighsDebugStatus debugAnalysePrimalDualErrors(
    const HighsOptions& options, HighsPrimalDualErrors& primal_dual_errors) {
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const bool force_report = options.highs_debug_level >= kHighsDebugLevelCostly;
  if (primal_dual_errors.num_nonzero_basic_duals >= 0) {
    if (primal_dual_errors.num_nonzero_basic_duals > 0) {
      value_adjective = "Error";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kLogicalError;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Nonzero basic duals:       num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_nonzero_basic_duals,
        primal_dual_errors.max_nonzero_basic_dual,
        primal_dual_errors.sum_nonzero_basic_duals);
  }
  if (primal_dual_errors.num_off_bound_nonbasic >= 0) {
    if (primal_dual_errors.num_off_bound_nonbasic > 0) {
      value_adjective = "Error";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kLogicalError;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Off-bound nonbasic values: num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_off_bound_nonbasic,
        primal_dual_errors.max_off_bound_nonbasic,
        primal_dual_errors.sum_off_bound_nonbasic);
  }
  if (primal_dual_errors.num_primal_residual >= 0) {
    if (primal_dual_errors.max_primal_residual.absolute_value >
        excessive_residual_error) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (primal_dual_errors.max_primal_residual.absolute_value >
               large_residual_error) {
      value_adjective = "Large";
      report_level = HighsLogType::kDetailed;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Primal residual:           num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_primal_residual,
        primal_dual_errors.max_primal_residual.absolute_value,
        primal_dual_errors.sum_primal_residual);
  }
  if (primal_dual_errors.num_dual_residual >= 0) {
    if (primal_dual_errors.max_dual_residual.absolute_value >
        excessive_residual_error) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (primal_dual_errors.max_dual_residual.absolute_value >
               large_residual_error) {
      value_adjective = "Large";
      report_level = HighsLogType::kDetailed;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Dual residual:             num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_dual_residual,
        primal_dual_errors.max_dual_residual.absolute_value,
        primal_dual_errors.sum_dual_residual);
  }
  return return_status;
}